

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O0

char * leveldb::GetLengthPrefixedSlice(char *p,char *limit,Slice *result)

{
  Slice local_40;
  uint local_2c;
  Slice *pSStack_28;
  uint32_t len;
  Slice *result_local;
  char *limit_local;
  char *p_local;
  
  pSStack_28 = result;
  result_local = (Slice *)limit;
  limit_local = p;
  limit_local = GetVarint32Ptr(p,limit,&local_2c);
  if (limit_local == (char *)0x0) {
    p_local = (char *)0x0;
  }
  else if (result_local < (Slice *)(limit_local + local_2c)) {
    p_local = (char *)0x0;
  }
  else {
    Slice::Slice(&local_40,limit_local,(ulong)local_2c);
    pSStack_28->data_ = local_40.data_;
    pSStack_28->size_ = local_40.size_;
    p_local = limit_local + local_2c;
  }
  return p_local;
}

Assistant:

const char* GetLengthPrefixedSlice(const char* p, const char* limit,
                                   Slice* result) {
  uint32_t len;
  p = GetVarint32Ptr(p, limit, &len);
  if (p == nullptr) return nullptr;
  if (p + len > limit) return nullptr;
  *result = Slice(p, len);
  return p + len;
}